

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersector1<4,_16777232,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  undefined8 uVar9;
  Geometry *this;
  uint uVar10;
  uint uVar11;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar51;
  float fVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar53;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar50;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar65;
  float fVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar70 [16];
  float fVar74;
  float fVar76;
  float fVar77;
  undefined1 auVar75 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  fVar1 = (query->p).field_0.field_0.x;
  fVar2 = (query->p).field_0.field_0.y;
  fVar3 = (query->p).field_0.field_0.z;
  fVar74 = (context->query_radius).field_0.m128[0];
  fVar76 = (context->query_radius).field_0.m128[1];
  fVar77 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar75 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    auVar75 = dpps((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  pSVar22 = stack + 1;
  bVar15 = false;
  do {
LAB_0068acfc:
    do {
      do {
        if (pSVar22 == stack) {
          return bVar15;
        }
        pSVar12 = pSVar22 + -1;
        pSVar22 = pSVar22 + -1;
      } while (auVar75._0_4_ < (float)pSVar12->dist);
      sVar17 = (pSVar22->ptr).ptr;
LAB_0068ad19:
      uVar18 = (uint)sVar17;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((sVar17 & 8) != 0) goto LAB_0068b12e;
        uVar16 = sVar17 & 0xfffffffffffffff0;
        fVar44 = query->time;
        auVar35._4_4_ = fVar44;
        auVar35._0_4_ = fVar44;
        auVar35._8_4_ = fVar44;
        auVar35._12_4_ = fVar44;
        auVar40._0_4_ = *(float *)(uVar16 + 0x80) * fVar44 + *(float *)(uVar16 + 0x20);
        auVar40._4_4_ = *(float *)(uVar16 + 0x84) * fVar44 + *(float *)(uVar16 + 0x24);
        auVar40._8_4_ = *(float *)(uVar16 + 0x88) * fVar44 + *(float *)(uVar16 + 0x28);
        auVar40._12_4_ = *(float *)(uVar16 + 0x8c) * fVar44 + *(float *)(uVar16 + 0x2c);
        auVar37._0_4_ = *(float *)(uVar16 + 0xa0) * fVar44 + *(float *)(uVar16 + 0x40);
        auVar37._4_4_ = *(float *)(uVar16 + 0xa4) * fVar44 + *(float *)(uVar16 + 0x44);
        auVar37._8_4_ = *(float *)(uVar16 + 0xa8) * fVar44 + *(float *)(uVar16 + 0x48);
        auVar37._12_4_ = *(float *)(uVar16 + 0xac) * fVar44 + *(float *)(uVar16 + 0x4c);
        auVar33._0_4_ = *(float *)(uVar16 + 0xc0) * fVar44 + *(float *)(uVar16 + 0x60);
        auVar33._4_4_ = *(float *)(uVar16 + 0xc4) * fVar44 + *(float *)(uVar16 + 100);
        auVar33._8_4_ = *(float *)(uVar16 + 200) * fVar44 + *(float *)(uVar16 + 0x68);
        auVar33._12_4_ = *(float *)(uVar16 + 0xcc) * fVar44 + *(float *)(uVar16 + 0x6c);
        auVar47._0_4_ = *(float *)(uVar16 + 0x90) * fVar44 + *(float *)(uVar16 + 0x30);
        auVar47._4_4_ = *(float *)(uVar16 + 0x94) * fVar44 + *(float *)(uVar16 + 0x34);
        auVar47._8_4_ = *(float *)(uVar16 + 0x98) * fVar44 + *(float *)(uVar16 + 0x38);
        auVar47._12_4_ = *(float *)(uVar16 + 0x9c) * fVar44 + *(float *)(uVar16 + 0x3c);
        auVar59._0_4_ = *(float *)(uVar16 + 0xb0) * fVar44 + *(float *)(uVar16 + 0x50);
        auVar59._4_4_ = *(float *)(uVar16 + 0xb4) * fVar44 + *(float *)(uVar16 + 0x54);
        auVar59._8_4_ = *(float *)(uVar16 + 0xb8) * fVar44 + *(float *)(uVar16 + 0x58);
        auVar59._12_4_ = *(float *)(uVar16 + 0xbc) * fVar44 + *(float *)(uVar16 + 0x5c);
        auVar55._0_4_ = *(float *)(uVar16 + 0xd0) * fVar44 + *(float *)(uVar16 + 0x70);
        auVar55._4_4_ = *(float *)(uVar16 + 0xd4) * fVar44 + *(float *)(uVar16 + 0x74);
        auVar55._8_4_ = *(float *)(uVar16 + 0xd8) * fVar44 + *(float *)(uVar16 + 0x78);
        auVar55._12_4_ = *(float *)(uVar16 + 0xdc) * fVar44 + *(float *)(uVar16 + 0x7c);
        auVar63._4_4_ = fVar1;
        auVar63._0_4_ = fVar1;
        auVar63._8_4_ = fVar1;
        auVar63._12_4_ = fVar1;
        auVar43 = maxps(auVar63,auVar40);
        auVar43 = minps(auVar43,auVar47);
        fVar44 = auVar43._0_4_ - fVar1;
        fVar52 = auVar43._4_4_ - fVar1;
        fVar60 = auVar43._8_4_ - fVar1;
        fVar66 = auVar43._12_4_ - fVar1;
        auVar70._4_4_ = fVar2;
        auVar70._0_4_ = fVar2;
        auVar70._8_4_ = fVar2;
        auVar70._12_4_ = fVar2;
        auVar43 = maxps(auVar70,auVar37);
        auVar43 = minps(auVar43,auVar59);
        fVar68 = auVar43._0_4_ - fVar2;
        fVar71 = auVar43._4_4_ - fVar2;
        fVar72 = auVar43._8_4_ - fVar2;
        fVar73 = auVar43._12_4_ - fVar2;
        auVar64._4_4_ = fVar3;
        auVar64._0_4_ = fVar3;
        auVar64._8_4_ = fVar3;
        auVar64._12_4_ = fVar3;
        auVar43 = maxps(auVar64,auVar33);
        auVar43 = minps(auVar43,auVar55);
        fVar51 = auVar43._0_4_ - fVar3;
        fVar53 = auVar43._4_4_ - fVar3;
        fVar65 = auVar43._8_4_ - fVar3;
        fVar67 = auVar43._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar51 * fVar51 + fVar68 * fVar68 + fVar44 * fVar44;
        tNear.field_0.v[1] = fVar53 * fVar53 + fVar71 * fVar71 + fVar52 * fVar52;
        tNear.field_0.v[2] = fVar65 * fVar65 + fVar72 * fVar72 + fVar60 * fVar60;
        tNear.field_0.v[3] = fVar67 * fVar67 + fVar73 * fVar73 + fVar66 * fVar66;
        uVar10 = (uint)(((auVar33._0_4_ <= fVar77 + fVar3 && fVar1 - fVar74 <= auVar47._0_4_) &&
                        (auVar37._0_4_ <= fVar76 + fVar2 && auVar40._0_4_ <= fVar1 + fVar74)) &&
                       (fVar3 - fVar77 <= auVar55._0_4_ &&
                       (fVar2 - fVar76 <= auVar59._0_4_ && auVar40._0_4_ <= auVar47._0_4_)));
        auVar62._0_4_ = -uVar10;
        uVar11 = (uint)(((auVar33._4_4_ <= fVar77 + fVar3 && fVar1 - fVar74 <= auVar47._4_4_) &&
                        (auVar37._4_4_ <= fVar76 + fVar2 && auVar40._4_4_ <= fVar1 + fVar74)) &&
                       (fVar3 - fVar77 <= auVar55._4_4_ &&
                       (fVar2 - fVar76 <= auVar59._4_4_ && auVar40._4_4_ <= auVar47._4_4_)));
        auVar62._4_4_ = -uVar11;
        uVar6 = (uint)(((auVar33._8_4_ <= fVar77 + fVar3 && fVar1 - fVar74 <= auVar47._8_4_) &&
                       (auVar37._8_4_ <= fVar76 + fVar2 && auVar40._8_4_ <= fVar1 + fVar74)) &&
                      (fVar3 - fVar77 <= auVar55._8_4_ &&
                      (fVar2 - fVar76 <= auVar59._8_4_ && auVar40._8_4_ <= auVar47._8_4_)));
        auVar62._8_4_ = -uVar6;
        uVar5 = (uint)(((auVar33._12_4_ <= fVar77 + fVar3 && fVar1 - fVar74 <= auVar47._12_4_) &&
                       (auVar37._12_4_ <= fVar76 + fVar2 && auVar40._12_4_ <= fVar1 + fVar74)) &&
                      (fVar3 - fVar77 <= auVar55._12_4_ &&
                      (fVar2 - fVar76 <= auVar59._12_4_ && auVar40._12_4_ <= auVar47._12_4_)));
        auVar62._12_4_ = -uVar5;
        if ((uVar18 & 7) == 6) goto LAB_0068af40;
        auVar62._0_4_ = uVar10 * -0x80000000;
        auVar62._4_4_ = uVar11 * -0x80000000;
        auVar62._8_4_ = uVar6 * -0x80000000;
        auVar62._12_4_ = uVar5 * -0x80000000;
LAB_0068adf0:
        uVar18 = movmskps(uVar18 & 7,auVar62);
LAB_0068adf3:
        if (uVar18 != 0) {
          uVar16 = sVar17 & 0xfffffffffffffff0;
          lVar19 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          sVar17 = *(size_t *)(uVar16 + lVar19 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 != 0) {
            uVar5 = tNear.field_0.i[lVar19];
            lVar19 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            sVar8 = *(size_t *)(uVar16 + lVar19 * 8);
            uVar6 = tNear.field_0.i[lVar19];
            uVar18 = uVar18 - 1 & uVar18;
            if (uVar18 == 0) {
              if (uVar5 < uVar6) {
                (pSVar22->ptr).ptr = sVar8;
                pSVar22->dist = uVar6;
                pSVar22 = pSVar22 + 1;
              }
              else {
                (pSVar22->ptr).ptr = sVar17;
                pSVar22->dist = uVar5;
                pSVar22 = pSVar22 + 1;
                sVar17 = sVar8;
              }
            }
            else {
              auVar34._8_4_ = uVar5;
              auVar34._0_8_ = sVar17;
              auVar34._12_4_ = 0;
              auVar41._8_4_ = uVar6;
              auVar41._0_8_ = sVar8;
              auVar41._12_4_ = 0;
              lVar19 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              uVar9 = *(undefined8 *)(uVar16 + lVar19 * 8);
              iVar7 = tNear.field_0.i[lVar19];
              auVar38._8_4_ = iVar7;
              auVar38._0_8_ = uVar9;
              auVar38._12_4_ = 0;
              auVar25._8_4_ = -(uint)((int)uVar5 < (int)uVar6);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar25._4_4_ = auVar25._8_4_;
                auVar25._0_4_ = auVar25._8_4_;
                auVar25._12_4_ = auVar25._8_4_;
                auVar48._8_4_ = uVar6;
                auVar48._0_8_ = sVar8;
                auVar48._12_4_ = 0;
                auVar62 = blendvps(auVar48,auVar34,auVar25);
                auVar35 = blendvps(auVar34,auVar41,auVar25);
                auVar26._8_4_ = -(uint)(auVar62._8_4_ < iVar7);
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                auVar42._8_4_ = iVar7;
                auVar42._0_8_ = uVar9;
                auVar42._12_4_ = 0;
                auVar43 = blendvps(auVar42,auVar62,auVar26);
                auVar62 = blendvps(auVar62,auVar38,auVar26);
                auVar27._8_4_ = -(uint)(auVar35._8_4_ < auVar62._8_4_);
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                SVar39 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar62,auVar35,auVar27);
                SVar36 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar35,auVar62,auVar27);
                *pSVar22 = SVar36;
                pSVar22[1] = SVar39;
                sVar17 = auVar43._0_8_;
                pSVar22 = pSVar22 + 2;
              }
              else {
                lVar19 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                auVar28._4_4_ = auVar25._8_4_;
                auVar28._0_4_ = auVar25._8_4_;
                auVar28._8_4_ = auVar25._8_4_;
                auVar28._12_4_ = auVar25._8_4_;
                auVar49 = blendvps(auVar41,auVar34,auVar28);
                auVar35 = blendvps(auVar34,auVar41,auVar28);
                auVar56._8_4_ = tNear.field_0.i[lVar19];
                auVar56._0_8_ = *(undefined8 *)(uVar16 + lVar19 * 8);
                auVar56._12_4_ = 0;
                auVar29._8_4_ = -(uint)(iVar7 < tNear.field_0.i[lVar19]);
                auVar29._4_4_ = auVar29._8_4_;
                auVar29._0_4_ = auVar29._8_4_;
                auVar29._12_4_ = auVar29._8_4_;
                auVar62 = blendvps(auVar56,auVar38,auVar29);
                auVar43 = blendvps(auVar38,auVar56,auVar29);
                auVar30._8_4_ = -(uint)(auVar35._8_4_ < auVar43._8_4_);
                auVar30._4_4_ = auVar30._8_4_;
                auVar30._0_4_ = auVar30._8_4_;
                auVar30._12_4_ = auVar30._8_4_;
                auVar57 = blendvps(auVar43,auVar35,auVar30);
                SVar36 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar35,auVar43,auVar30);
                auVar31._8_4_ = -(uint)(auVar49._8_4_ < auVar62._8_4_);
                auVar31._4_4_ = auVar31._8_4_;
                auVar31._0_4_ = auVar31._8_4_;
                auVar31._12_4_ = auVar31._8_4_;
                auVar35 = blendvps(auVar62,auVar49,auVar31);
                auVar43 = blendvps(auVar49,auVar62,auVar31);
                auVar32._8_4_ = -(uint)(auVar43._8_4_ < auVar57._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                SVar39 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar57,auVar43,auVar32);
                SVar50 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar43,auVar57,auVar32);
                *pSVar22 = SVar36;
                pSVar22[1] = SVar50;
                pSVar22[2] = SVar39;
                sVar17 = auVar35._0_8_;
                pSVar22 = pSVar22 + 3;
              }
            }
          }
          goto LAB_0068ad19;
        }
        goto LAB_0068acfc;
      }
      if ((sVar17 & 8) == 0) {
        uVar16 = sVar17 & 0xfffffffffffffff0;
        fVar44 = query->time;
        auVar35._4_4_ = fVar44;
        auVar35._0_4_ = fVar44;
        auVar35._8_4_ = fVar44;
        auVar35._12_4_ = fVar44;
        auVar43._0_4_ = *(float *)(uVar16 + 0x80) * fVar44 + *(float *)(uVar16 + 0x20);
        auVar43._4_4_ = *(float *)(uVar16 + 0x84) * fVar44 + *(float *)(uVar16 + 0x24);
        auVar43._8_4_ = *(float *)(uVar16 + 0x88) * fVar44 + *(float *)(uVar16 + 0x28);
        auVar43._12_4_ = *(float *)(uVar16 + 0x8c) * fVar44 + *(float *)(uVar16 + 0x2c);
        auVar45._0_4_ = *(float *)(uVar16 + 0xa0) * fVar44 + *(float *)(uVar16 + 0x40);
        auVar45._4_4_ = *(float *)(uVar16 + 0xa4) * fVar44 + *(float *)(uVar16 + 0x44);
        auVar45._8_4_ = *(float *)(uVar16 + 0xa8) * fVar44 + *(float *)(uVar16 + 0x48);
        auVar45._12_4_ = *(float *)(uVar16 + 0xac) * fVar44 + *(float *)(uVar16 + 0x4c);
        auVar57._0_4_ = *(float *)(uVar16 + 0xc0) * fVar44 + *(float *)(uVar16 + 0x60);
        auVar57._4_4_ = *(float *)(uVar16 + 0xc4) * fVar44 + *(float *)(uVar16 + 100);
        auVar57._8_4_ = *(float *)(uVar16 + 200) * fVar44 + *(float *)(uVar16 + 0x68);
        auVar57._12_4_ = *(float *)(uVar16 + 0xcc) * fVar44 + *(float *)(uVar16 + 0x6c);
        auVar49._0_4_ = *(float *)(uVar16 + 0x90) * fVar44 + *(float *)(uVar16 + 0x30);
        auVar49._4_4_ = *(float *)(uVar16 + 0x94) * fVar44 + *(float *)(uVar16 + 0x34);
        auVar49._8_4_ = *(float *)(uVar16 + 0x98) * fVar44 + *(float *)(uVar16 + 0x38);
        auVar49._12_4_ = *(float *)(uVar16 + 0x9c) * fVar44 + *(float *)(uVar16 + 0x3c);
        auVar54._0_4_ = *(float *)(uVar16 + 0xb0) * fVar44 + *(float *)(uVar16 + 0x50);
        auVar54._4_4_ = *(float *)(uVar16 + 0xb4) * fVar44 + *(float *)(uVar16 + 0x54);
        auVar54._8_4_ = *(float *)(uVar16 + 0xb8) * fVar44 + *(float *)(uVar16 + 0x58);
        auVar54._12_4_ = *(float *)(uVar16 + 0xbc) * fVar44 + *(float *)(uVar16 + 0x5c);
        auVar58._0_4_ = *(float *)(uVar16 + 0xd0) * fVar44 + *(float *)(uVar16 + 0x70);
        auVar58._4_4_ = *(float *)(uVar16 + 0xd4) * fVar44 + *(float *)(uVar16 + 0x74);
        auVar58._8_4_ = *(float *)(uVar16 + 0xd8) * fVar44 + *(float *)(uVar16 + 0x78);
        auVar58._12_4_ = *(float *)(uVar16 + 0xdc) * fVar44 + *(float *)(uVar16 + 0x7c);
        auVar61._4_4_ = fVar1;
        auVar61._0_4_ = fVar1;
        auVar61._8_4_ = fVar1;
        auVar61._12_4_ = fVar1;
        auVar62 = maxps(auVar61,auVar43);
        auVar62 = minps(auVar62,auVar49);
        fVar60 = auVar62._0_4_ - fVar1;
        fVar65 = auVar62._4_4_ - fVar1;
        fVar66 = auVar62._8_4_ - fVar1;
        fVar67 = auVar62._12_4_ - fVar1;
        auVar69._4_4_ = fVar2;
        auVar69._0_4_ = fVar2;
        auVar69._8_4_ = fVar2;
        auVar69._12_4_ = fVar2;
        auVar62 = maxps(auVar69,auVar45);
        auVar62 = minps(auVar62,auVar54);
        fVar68 = auVar62._0_4_ - fVar2;
        fVar71 = auVar62._4_4_ - fVar2;
        fVar72 = auVar62._8_4_ - fVar2;
        fVar73 = auVar62._12_4_ - fVar2;
        auVar46._4_4_ = fVar3;
        auVar46._0_4_ = fVar3;
        auVar46._8_4_ = fVar3;
        auVar46._12_4_ = fVar3;
        auVar62 = maxps(auVar46,auVar57);
        auVar62 = minps(auVar62,auVar58);
        fVar44 = auVar62._0_4_ - fVar3;
        fVar51 = auVar62._4_4_ - fVar3;
        fVar52 = auVar62._8_4_ - fVar3;
        fVar53 = auVar62._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar44 * fVar44 + fVar68 * fVar68 + fVar60 * fVar60;
        tNear.field_0.v[1] = fVar51 * fVar51 + fVar71 * fVar71 + fVar65 * fVar65;
        tNear.field_0.v[2] = fVar52 * fVar52 + fVar72 * fVar72 + fVar66 * fVar66;
        tNear.field_0.v[3] = fVar53 * fVar53 + fVar73 * fVar73 + fVar67 * fVar67;
        auVar62._0_4_ =
             -(uint)(auVar43._0_4_ <= auVar49._0_4_ && tNear.field_0.v[0] <= fVar74 * fVar74);
        auVar62._4_4_ =
             -(uint)(auVar43._4_4_ <= auVar49._4_4_ && tNear.field_0.v[1] <= fVar74 * fVar74);
        auVar62._8_4_ =
             -(uint)(auVar43._8_4_ <= auVar49._8_4_ && tNear.field_0.v[2] <= fVar74 * fVar74);
        auVar62._12_4_ =
             -(uint)(auVar43._12_4_ <= auVar49._12_4_ && tNear.field_0.v[3] <= fVar74 * fVar74);
        if ((uVar18 & 7) != 6) goto LAB_0068adf0;
LAB_0068af40:
        uVar16 = sVar17 & 0xfffffffffffffff0;
        auVar24._0_4_ =
             (-(uint)(auVar35._0_4_ < *(float *)(uVar16 + 0xf0) &&
                     *(float *)(uVar16 + 0xe0) <= auVar35._0_4_) & auVar62._0_4_) << 0x1f;
        auVar24._4_4_ =
             (-(uint)(auVar35._4_4_ < *(float *)(uVar16 + 0xf4) &&
                     *(float *)(uVar16 + 0xe4) <= auVar35._4_4_) & auVar62._4_4_) << 0x1f;
        auVar24._8_4_ =
             (-(uint)(auVar35._8_4_ < *(float *)(uVar16 + 0xf8) &&
                     *(float *)(uVar16 + 0xe8) <= auVar35._8_4_) & auVar62._8_4_) << 0x1f;
        auVar24._12_4_ =
             (-(uint)(auVar35._12_4_ < *(float *)(uVar16 + 0xfc) &&
                     *(float *)(uVar16 + 0xec) <= auVar35._12_4_) & auVar62._12_4_) << 0x1f;
        uVar18 = movmskps(uVar18 & 7,auVar24);
        goto LAB_0068adf3;
      }
LAB_0068b12e:
      lVar23 = (sVar17 & 0xfffffffffffffff0) + 0x130;
      bVar14 = 0;
      for (lVar19 = 0; lVar19 != (ulong)(uVar18 & 0xf) - 8; lVar19 = lVar19 + 1) {
        bVar20 = 0;
        for (lVar21 = -0x10; lVar21 != 0; lVar21 = lVar21 + 4) {
          uVar5 = *(uint *)(lVar23 + lVar21);
          if ((ulong)uVar5 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar5].ptr;
          context->geomID = uVar5;
          context->primID = *(uint *)(lVar23 + 0x10 + lVar21);
          bVar13 = Geometry::pointQuery(this,query,context);
          bVar20 = bVar20 | bVar13;
        }
        bVar14 = bVar14 | bVar20;
        lVar23 = lVar23 + 0x140;
      }
    } while (bVar14 == 0);
    auVar75 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar74 = auVar75._0_4_;
    fVar76 = auVar75._4_4_;
    fVar77 = auVar75._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar75 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      auVar75 = dpps(auVar75,auVar75,0x7f);
    }
    bVar15 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }